

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.cpp
# Opt level: O0

idx_t duckdb::TaskScheduler::GetEstimatedCPUId(void)

{
  int iVar1;
  id __id;
  int cpu;
  undefined4 in_stack_fffffffffffffff0;
  undefined8 local_8;
  
  iVar1 = sched_getcpu();
  if (iVar1 < 0) {
    __id = ::std::this_thread::get_id();
    local_8 = ::std::hash<std::thread::id>::operator()
                        ((hash<std::thread::id> *)CONCAT44(iVar1,in_stack_fffffffffffffff0),
                         (id *)__id._M_thread);
  }
  else {
    local_8 = (size_t)iVar1;
  }
  return local_8;
}

Assistant:

idx_t TaskScheduler::GetEstimatedCPUId() {
#if defined(EMSCRIPTEN)
	// FIXME: Wasm + multithreads can likely be implemented as
	//   return return (idx_t)std::hash<std::thread::id>()(std::this_thread::get_id());
	return 0;
#else
	// this code comes from jemalloc
#if defined(_WIN32)
	return (idx_t)GetCurrentProcessorNumber();
#elif defined(_GNU_SOURCE)
	auto cpu = sched_getcpu();
	if (cpu < 0) {
#ifndef DUCKDB_NO_THREADS
		// fallback to thread id
		return (idx_t)std::hash<std::thread::id>()(std::this_thread::get_id());
#else

		return 0;
#endif
	}
	return (idx_t)cpu;
#elif defined(__aarch64__) && defined(__APPLE__)
	/* Other oses most likely use tpidr_el0 instead */
	uintptr_t c;
	asm volatile("mrs %x0, tpidrro_el0" : "=r"(c)::"memory");
	return (idx_t)(c & (1 << 3) - 1);
#else
#ifndef DUCKDB_NO_THREADS
	// fallback to thread id
	return (idx_t)std::hash<std::thread::id>()(std::this_thread::get_id());
#else
	return 0;
#endif
#endif
#endif
}